

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_error.cc
# Opt level: O3

void RM_PrintError(RC rc)

{
  size_t sVar1;
  int *piVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  
  if (rc - 0x65U < 0xb) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"RM warning: ",0xc);
    pcVar4 = RM_WarnMsg[rc - 0x65U];
    sVar1 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar1);
    pcVar4 = "\n";
    lVar3 = 1;
    poVar5 = (ostream *)&std::cerr;
  }
  else if (rc == 0) {
    poVar5 = (ostream *)&std::cerr;
    pcVar4 = "RM_PrintError called with return code of 0\n";
    lVar3 = 0x2b;
  }
  else if (rc == -0xb) {
    piVar2 = __errno_location();
    pcVar4 = strerror(*piVar2);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12b300);
    }
    else {
      sVar1 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar1);
    }
    poVar5 = (ostream *)&std::cerr;
    pcVar4 = "\n";
    lVar3 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"RM error: ",10);
    poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,rc);
    pcVar4 = " is out of bounds\n";
    lVar3 = 0x12;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
  return;
}

Assistant:

void RM_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_RM_WARN && rc <= RM_LASTWARN)
    // Print warning
    cerr << "RM warning: " << RM_WarnMsg[rc - START_RM_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_RM_ERR && -rc < -RM_LASTERROR)
    // Print error
    cerr << "RM error: " << RM_ErrorMsg[-rc + START_RM_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "RM_PrintError called with return code of 0\n";
  else
    cerr << "RM error: " << rc << " is out of bounds\n";
}